

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O0

void __thiscall sf::priv::ClipboardImpl::setStringImpl(ClipboardImpl *this,String *text)

{
  pointer puVar1;
  ostream *poVar2;
  String *in_RSI;
  String *in_RDI;
  
  String::operator=(in_RSI,in_RDI);
  XSetSelectionOwner((in_RDI->m_string)._M_string_length,
                     (in_RDI->m_string).field_2._M_allocated_capacity,
                     (in_RDI->m_string)._M_dataplus._M_p,0);
  puVar1 = (pointer)XGetSelectionOwner((in_RDI->m_string)._M_string_length,
                                       (in_RDI->m_string).field_2._M_allocated_capacity);
  if (puVar1 != (in_RDI->m_string)._M_dataplus._M_p) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,
                             "Cannot set clipboard string: Unable to get ownership of X selection");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ClipboardImpl::setStringImpl(const String& text)
{
    m_clipboardContents = text;

    // Set our window as the current owner of the selection
    XSetSelectionOwner(m_display, m_clipboard, m_window, CurrentTime);

    // Check if setting the selection owner was successful
    if (XGetSelectionOwner(m_display, m_clipboard) != m_window)
        err() << "Cannot set clipboard string: Unable to get ownership of X selection" << std::endl;
}